

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void check_bin_z85<zmq::sockopt::array_option<49,2>>
               (socket_base *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2)

{
  __type _Var1;
  int iVar2;
  pointer puVar3;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bin_val;
  AssertionHandler catchAssertionHandler;
  uint8_t *dret;
  ITransientExpression local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  char *local_78;
  ulong local_70;
  string *local_68;
  string bv;
  string sv;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&bin_val,0x20,(allocator_type *)&catchAssertionHandler);
  dret = (uint8_t *)
         zmq_z85_decode(bin_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,(param_2->_M_dataplus)._M_p);
  local_90._vptr_ITransientExpression = (_func_int **)0x18a9c9;
  local_90.m_isBinaryExpression = true;
  local_90.m_result = false;
  local_90._10_6_ = 0;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0xf;
  capturedExpression.m_start = "dret != nullptr";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)&local_90,capturedExpression,
             ContinueOnFailure);
  local_68 = &sv;
  sv._M_dataplus._M_p = (pointer)0x0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dret;
  local_90.m_result = dret != (uint8_t *)0x0;
  local_90.m_isBinaryExpression = true;
  local_90._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d7890;
  local_78 = "!=";
  local_70 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_90);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  zmq::detail::socket_base::set<49,2>(param_1,param_2);
  puVar3 = (pointer)0x0;
  if (bin_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      bin_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    puVar3 = bin_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  zmq::detail::socket_base::set<49,2>(param_1,puVar3);
  zmq::detail::socket_base::get<49,2>(&sv,param_1,0x400);
  local_90._vptr_ITransientExpression = (_func_int **)0x18a9c9;
  local_90.m_isBinaryExpression = true;
  local_90.m_result = false;
  local_90._10_6_ = 0;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0xd;
  capturedExpression_00.m_start = "sv == str_val";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)&local_90,capturedExpression_00,
             ContinueOnFailure);
  _Var1 = std::operator==(&sv,param_2);
  local_90.m_result = _Var1;
  local_90.m_isBinaryExpression = true;
  local_90._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d78d0;
  local_78 = "==";
  local_70 = 2;
  local_80 = &sv;
  local_68 = param_2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_90);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  zmq::detail::socket_base::get<49,2>(&bv,param_1,0x20);
  local_90._vptr_ITransientExpression = (_func_int **)0x18a9c9;
  local_90.m_isBinaryExpression = true;
  local_90.m_result = false;
  local_90._10_6_ = 0;
  macroName_01.m_size = 7;
  macroName_01.m_start = "REQUIRE";
  capturedExpression_01.m_size = 0x1b;
  capturedExpression_01.m_start = "bv.size() == bin_val.size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)&local_90,capturedExpression_01,
             Normal);
  local_68 = (string *)
             ((long)bin_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)bin_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_start);
  local_90.m_result = (string *)bv._M_string_length == local_68;
  local_90.m_isBinaryExpression = true;
  local_90._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d71d0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             bv._M_string_length;
  local_78 = "==";
  local_70 = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_90);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_90._vptr_ITransientExpression = (_func_int **)0x18a9c9;
  local_90.m_isBinaryExpression = true;
  local_90.m_result = false;
  local_90._10_6_ = 0;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x3b;
  capturedExpression_02.m_start = "std::memcmp(bv.data(), bin_val.data(), bin_val.size()) == 0";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)&local_90,capturedExpression_02,
             ContinueOnFailure);
  iVar2 = memcmp(bv._M_dataplus._M_p,
                 bin_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (long)bin_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)bin_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  local_90.m_result = iVar2 == 0;
  local_90.m_isBinaryExpression = true;
  local_90._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d7490;
  local_90._12_4_ = iVar2;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x189356;
  local_78 = (char *)0x2;
  local_70 = local_70 & 0xffffffff00000000;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_90);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&bv);
  std::__cxx11::string::~string((string *)&sv);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bin_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void check_bin_z85(T opt, zmq::socket_t &sock, std::string str_val)
{
    std::vector<uint8_t> bin_val(32);
    const auto dret = zmq_z85_decode(bin_val.data(), str_val.c_str());
    CHECK(dret != nullptr);

    sock.set(opt, str_val);
    sock.set(opt, zmq::buffer(bin_val));
    auto sv = sock.get(opt);
    CHECK(sv == str_val);

    auto bv = sock.get(opt, 32);
    REQUIRE(bv.size() == bin_val.size());
    CHECK(std::memcmp(bv.data(), bin_val.data(), bin_val.size()) == 0);
}